

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyGen.cpp
# Opt level: O0

SequenceD<48> * __thiscall KeyGen::next(SequenceD<48> *__return_storage_ptr__,KeyGen *this)

{
  int iVar1;
  const_reference pvVar2;
  Permutation<56,_48> local_1d;
  int local_1c;
  KeyGen *pKStack_18;
  value_type n;
  KeyGen *this_local;
  
  iVar1 = this->m_round;
  this->m_round = iVar1 + 1;
  pKStack_18 = this;
  this_local = (KeyGen *)__return_storage_ptr__;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&SCHEDULED_LEFT_SHIFTS,(long)iVar1);
  local_1c = *pvVar2;
  SequenceD<56>::shift(&this->m_rolling,local_1c);
  Permutation<56,_48>::operator()(__return_storage_ptr__,&local_1d,&this->m_rolling,&PC2);
  return __return_storage_ptr__;
}

Assistant:

SequenceD<48> KeyGen::next() {
    auto n = SCHEDULED_LEFT_SHIFTS[m_round++];
    m_rolling.shift(n);
    return Permutation<56, 48>{}(m_rolling, PC2);
}